

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

xmlSaveCtxtPtr
xmlSaveToIO(xmlOutputWriteCallback iowrite,xmlOutputCloseCallback ioclose,void *ioctx,char *encoding
           ,int options)

{
  xmlSaveCtxtPtr ctxt;
  xmlOutputBufferPtr pxVar1;
  
  ctxt = xmlNewSaveCtxt(encoding,options);
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    pxVar1 = xmlOutputBufferCreateIO(iowrite,ioclose,ioctx,ctxt->handler);
    ctxt->buf = pxVar1;
    if (pxVar1 != (xmlOutputBufferPtr)0x0) {
      return ctxt;
    }
    xmlFreeSaveCtxt(ctxt);
  }
  return (xmlSaveCtxtPtr)0x0;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToIO(xmlOutputWriteCallback iowrite,
            xmlOutputCloseCallback ioclose,
            void *ioctx, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateIO(iowrite, ioclose, ioctx, ret->handler);
    if (ret->buf == NULL) {
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}